

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

void __thiscall Centaurus::CharClass<char>::parse(CharClass<char> *this,Stream *stream)

{
  wchar_t wVar1;
  wchar_t ch;
  wchar_t ch_00;
  StreamException *__return_storage_ptr__;
  int iVar2;
  char cVar3;
  wchar_t wVar4;
  bool bVar5;
  bool bVar6;
  CharClass<char> local_50;
  
  wVar1 = Stream::get(stream);
  ch = wVar1;
  if (wVar1 == L'^') {
    ch = Stream::get(stream);
  }
  iVar2 = 0;
  wVar4 = L'\0';
  do {
    cVar3 = (char)wVar4;
    if (ch == L']') {
      if (iVar2 == 1) {
        local_50._vptr_CharClass = (_func_int **)&PTR__Range_00192290;
        local_50.m_ranges.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_start._1_1_ = cVar3 + '\x01';
        local_50.m_ranges.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_start._0_1_ = cVar3;
        operator|=(this,(Range<char> *)&local_50);
      }
      else if (iVar2 == 2) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L']');
LAB_00115e5f:
        __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                    StreamException::~StreamException);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<Centaurus::Range<char>*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->m_ranges).
                 super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->m_ranges).
                 super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if (wVar1 == L'^') {
        operator~(&local_50,this);
        std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::
        _M_move_assign(&this->m_ranges,&local_50.m_ranges);
        ~CharClass(&local_50);
      }
      return;
    }
    if ((ch == L'\xffff') || (ch == L'\0')) {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,ch);
      goto LAB_00115e5f;
    }
    ch_00 = ch;
    if (((ch == L'\\') && (ch_00 = Stream::get(stream), 2 < (uint)(ch_00 + L'\xffffffa5'))) &&
       (ch_00 != L'-')) {
      if (ch_00 == L'N') {
LAB_00115d08:
        ch_00 = L'\n';
      }
      else if (ch_00 == L'R') {
LAB_00115d04:
        ch_00 = L'\r';
      }
      else {
        if (ch_00 != L't') {
          if (ch_00 == L'n') goto LAB_00115d08;
          if (ch_00 == L'r') goto LAB_00115d04;
          if (ch_00 != L'T') {
            __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
            Stream::unexpected(__return_storage_ptr__,stream,ch_00);
            goto LAB_00115e5f;
          }
        }
        ch_00 = L'\t';
      }
    }
    bVar5 = ch != L'\\';
    bVar6 = ch_00 == L'-';
    if (iVar2 == 2) {
      if (bVar6 && bVar5) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L'-');
        goto LAB_00115e5f;
      }
      local_50.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = (char)ch_00 + '\x01';
      local_50._vptr_CharClass = (_func_int **)&PTR__Range_00192290;
      local_50.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = cVar3;
      operator|=(this,(Range<char> *)&local_50);
      iVar2 = 0;
      ch_00 = wVar4;
    }
    else if (iVar2 == 1) {
      if (bVar6 && bVar5) {
        iVar2 = 2;
        ch_00 = wVar4;
      }
      else {
        local_50._vptr_CharClass = (_func_int **)&PTR__Range_00192290;
        local_50.m_ranges.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_start._1_1_ = cVar3 + '\x01';
        local_50.m_ranges.
        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl
        .super__Vector_impl_data._M_start._0_1_ = cVar3;
        operator|=(this,(Range<char> *)&local_50);
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 1;
      if (bVar6 && bVar5) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L'-');
        goto LAB_00115e5f;
      }
    }
    ch = Stream::get(stream);
    wVar4 = ch_00;
  } while( true );
}

Assistant:

void CharClass<TCHAR>::parse(Stream& stream)
{
    wchar_t ch;
    bool invert_flag = false;

    ch = stream.get();
    if (ch == L'^')
    {
        invert_flag = true;
        ch = stream.get();
    }

    wchar_t start = 0;
    enum
    {
        CC_STATE_START = 0,
        CC_STATE_RANGE,
        CC_STATE_END
    } state = CC_STATE_START;
    for (; ch != L']'; ch = stream.get())
    {
        bool escaped = false;

        if (ch == L'\0' || ch == 0xFFFF)
            throw stream.unexpected(ch);

        if (ch == L'\\')
        {
            ch = stream.get();
            switch (ch)
            {
            case L'\\':
                ch = L'\\';
                break;
            case L'-':
                ch = L'-';
                break;
            case L'[':
                ch = L'[';
                break;
            case L']':
                ch = L']';
                break;
            case L't':
            case L'T':
                ch = L'\t';
                break;
            case L'r':
            case L'R':
                ch = L'\r';
                break;
            case L'n':
            case L'N':
                ch = L'\n';
                break;
            default:
                throw stream.unexpected(ch);
            }
            escaped = true;
        }
        switch (state)
        {
        case CC_STATE_START:
            if (!escaped && ch == L'-')
                throw stream.unexpected(ch);
            start = ch;
            state = CC_STATE_RANGE;
            break;
        case CC_STATE_RANGE:
            if (!escaped && ch == L'-')
            {
                state = CC_STATE_END;
            }
            else
            {
                *this |= Range<TCHAR>(start, start + 1);
                start = ch;
                state = CC_STATE_RANGE;
            }
            break;
        case CC_STATE_END:
            if (!escaped && ch == L'-')
            {
                throw stream.unexpected(ch);
            }
            else
            {
                *this |= Range<TCHAR>(start, ch + 1);
                state = CC_STATE_START;
            }
            break;
        }
    }
    if (state == CC_STATE_RANGE)
    {
        *this |= Range<TCHAR>(start, start + 1);
    }
    else if (state == CC_STATE_END)
    {
        throw stream.unexpected(L']');
    }

	std::sort(m_ranges.begin(), m_ranges.end());

	if (invert_flag)
	{
		*this = this->operator~();
	}
}